

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
          (RepeatedFieldAccessor *this,Field *data,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  string *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  ActualType tmp;
  string local_38 [40];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38,in_RDX);
  (**(code **)(*in_RDI + 0x28))(in_RDI,local_10,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Add(Field* data, const ValueType& value) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    // In this RepeatedFieldAccessor interface we pass/return data using
    // raw pointers. Type of the data these raw pointers point to should
    // be ActualType. Here we have a ValueType object and want a ActualType
    // pointer. We can't cast a ValueType pointer to an ActualType pointer
    // directly because their type might be different (for enums ValueType
    // may be a generated enum type while ActualType is int32). To be safe
    // we make a copy to get a temporary ActualType object and use it.
    ActualType tmp = static_cast<ActualType>(value);
    Add(data, static_cast<const Value*>(&tmp));
  }